

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_2f151d::Db::parseSourceName(Db *this,NameState *param_1)

{
  bool bVar1;
  char *pcVar2;
  StringView local_48;
  undefined1 local_38 [8];
  StringView Name;
  size_t Length;
  NameState *param_1_local;
  Db *this_local;
  
  Name.Last = (char *)0x0;
  bVar1 = parsePositiveInteger(this,(size_t *)&Name.Last);
  if (bVar1) {
    this_local = (Db *)0x0;
  }
  else {
    pcVar2 = (char *)numLeft(this);
    if ((pcVar2 < Name.Last) || (Name.Last == (char *)0x0)) {
      this_local = (Db *)0x0;
    }
    else {
      StringView::StringView((StringView *)local_38,this->First,Name.Last + (long)this->First);
      this->First = Name.Last + (long)this->First;
      StringView::StringView(&local_48,"_GLOBAL__N");
      bVar1 = StringView::startsWith((StringView *)local_38,local_48);
      if (bVar1) {
        this_local = (Db *)(anonymous_namespace)::Db::
                           make<(anonymous_namespace)::NameType,char_const(&)[22]>
                                     ((Db *)this,(char (*) [22])"(anonymous namespace)");
      }
      else {
        this_local = (Db *)(anonymous_namespace)::Db::
                           make<(anonymous_namespace)::NameType,StringView&>
                                     ((Db *)this,(StringView *)local_38);
      }
    }
  }
  return (Node *)this_local;
}

Assistant:

Node *Db::parseSourceName(NameState *) {
  size_t Length = 0;
  if (parsePositiveInteger(&Length))
    return nullptr;
  if (numLeft() < Length || Length == 0)
    return nullptr;
  StringView Name(First, First + Length);
  First += Length;
  if (Name.startsWith("_GLOBAL__N"))
    return make<NameType>("(anonymous namespace)");
  return make<NameType>(Name);
}